

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path_builder_unittest.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::PathBuilderMultiRootTest_TargetWithSameNameAsTrustAnchorFails_Test::TestBody
          (PathBuilderMultiRootTest_TargetWithSameNameAsTrustAnchorFails_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string *val;
  Message *message;
  AssertHelper local_248;
  Message local_240;
  StatusCode local_238;
  StatusCode local_234;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_1;
  VerifyError error;
  Message local_1e8;
  uint local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar_;
  Result result;
  undefined1 local_140 [8];
  CertPathBuilder path_builder;
  shared_ptr<const_bssl::ParsedCertificate> local_90;
  undefined1 local_80 [8];
  TrustStoreInMemory trust_store;
  PathBuilderMultiRootTest_TargetWithSameNameAsTrustAnchorFails_Test *this_local;
  
  trust_store.distrusted_spkis_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  TrustStoreInMemory::TrustStoreInMemory((TrustStoreInMemory *)local_80);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            (&local_90,&(this->super_PathBuilderMultiRootTest).a_by_b_);
  TrustStoreInMemory::AddTrustAnchor((TrustStoreInMemory *)local_80,&local_90);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr(&local_90);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
             &(this->super_PathBuilderMultiRootTest).a_by_b_);
  pcVar2 = (char *)0x0;
  CertPathBuilder::CertPathBuilder
            ((CertPathBuilder *)local_140,
             (shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit,
             (TrustStore *)local_80,
             (CertPathBuilderDelegate *)&(this->super_PathBuilderMultiRootTest).delegate_,
             &(this->super_PathBuilderMultiRootTest).time_,ANY_EKU,
             (this->super_PathBuilderMultiRootTest).initial_explicit_policy_,
             &(this->super_PathBuilderMultiRootTest).user_initial_policy_set_,
             (this->super_PathBuilderMultiRootTest).initial_policy_mapping_inhibit_,
             (this->super_PathBuilderMultiRootTest).initial_any_policy_inhibit_);
  ::std::shared_ptr<const_bssl::ParsedCertificate>::~shared_ptr
            ((shared_ptr<const_bssl::ParsedCertificate> *)&result.exceeded_iteration_limit);
  CertPathBuilder::Run((Result *)&gtest_ar_.message_,(CertPathBuilder *)local_140);
  bVar1 = CertPathBuilder::Result::HasValidPath((Result *)&gtest_ar_.message_);
  local_191 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_190,&local_191,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
  if (!bVar1) {
    testing::Message::Message(&local_1a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_190,
               (AssertionResult *)"result.HasValidPath()","true","false",pcVar2);
    pcVar2 = (char *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x10a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
    testing::internal::AssertHelper::~AssertHelper(&local_1a8);
    ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(&local_1a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
  local_1dc = 1;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
            ((EqHelper *)local_1d8,"1U","result.max_depth_seen",&local_1dc,
             (uint *)((long)&result.best_result_index + 4));
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x10b,pcVar2);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8),&local_1e8);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)((long)&error.diagnostic_.field_2 + 8));
    testing::Message::~Message(&local_1e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  CertPathBuilder::Result::GetBestPathVerifyError
            ((VerifyError *)&gtest_ar_1.message_,(Result *)&gtest_ar_.message_);
  local_234 = VerifyError::Code((VerifyError *)&gtest_ar_1.message_);
  local_238 = PATH_NOT_FOUND;
  testing::internal::EqHelper::
  Compare<bssl::VerifyError::StatusCode,_bssl::VerifyError::StatusCode,_nullptr>
            ((EqHelper *)local_230,"error.Code()","VerifyError::StatusCode::PATH_NOT_FOUND",
             &local_234,&local_238);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    val = VerifyError::DiagnosticString_abi_cxx11_((VerifyError *)&gtest_ar_1.message_);
    message = testing::Message::operator<<(&local_240,val);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/path_builder_unittest.cc"
               ,0x10d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_248,message);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message(&local_240);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  VerifyError::~VerifyError((VerifyError *)&gtest_ar_1.message_);
  CertPathBuilder::Result::~Result((Result *)&gtest_ar_.message_);
  CertPathBuilder::~CertPathBuilder((CertPathBuilder *)local_140);
  TrustStoreInMemory::~TrustStoreInMemory((TrustStoreInMemory *)local_80);
  return;
}

Assistant:

TEST_F(PathBuilderMultiRootTest, TargetWithSameNameAsTrustAnchorFails) {
  TrustStoreInMemory trust_store;
  trust_store.AddTrustAnchor(a_by_b_);

  CertPathBuilder path_builder(
      a_by_b_, &trust_store, &delegate_, time_, KeyPurpose::ANY_EKU,
      initial_explicit_policy_, user_initial_policy_set_,
      initial_policy_mapping_inhibit_, initial_any_policy_inhibit_);

  auto result = path_builder.Run();

  EXPECT_FALSE(result.HasValidPath());
  EXPECT_EQ(1U, result.max_depth_seen);
  VerifyError error = result.GetBestPathVerifyError();
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_NOT_FOUND)
      << error.DiagnosticString();
}